

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateAll
          (Generator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *context,string *error)

{
  FieldDescriptor *pFVar1;
  pointer pcVar2;
  ulong uVar3;
  GeneratorOptions *pGVar4;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined4 extraout_var;
  LogMessage *pLVar9;
  long *plVar10;
  GeneratorContext *output;
  pointer ppFVar11;
  _Alloc_hider _Var12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Base_ptr *pp_Var13;
  pointer ppFVar14;
  Descriptor *desc;
  FileDescriptor *pFVar15;
  _Base_ptr p_Var16;
  Printer *printer_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string *psVar18;
  Printer *printer_01;
  Printer *extraout_RDX;
  Printer *printer_02;
  GeneratorOptions *pGVar19;
  _Base_ptr p_Var20;
  undefined8 uVar21;
  Generator *pGVar22;
  Printer *pPVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  Descriptor *pDVar30;
  GeneratorOptions *pGVar31;
  string filename;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files_ordered;
  set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_> allowed_set;
  Printer printer;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  GeneratorOptions options;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  option_pairs;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Base_ptr local_208;
  size_t local_200;
  string local_1f8;
  string *local_1d8;
  GeneratorContext *local_1d0;
  Generator *local_1c8;
  undefined1 local_1c0 [32];
  _Base_ptr local_1a0;
  size_t local_198;
  undefined1 local_190 [8];
  undefined1 local_188 [8];
  undefined1 local_180 [40];
  undefined1 local_158 [24];
  _Base_ptr local_140;
  _Base_ptr local_138;
  _Base_ptr local_130;
  undefined1 local_108 [24];
  undefined1 local_f0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ImportStyle local_ac;
  bool local_a7;
  _Alloc_hider local_a0;
  _Base_ptr local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  bool local_80;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  FieldDescriptor *local_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  ZeroCopyOutputStream *pZVar8;
  undefined4 extraout_var_00;
  
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = context;
  local_1c8 = this;
  ParseGeneratorParameter(parameter,&local_48);
  GeneratorOptions::GeneratorOptions((GeneratorOptions *)local_f0);
  bVar5 = GeneratorOptions::ParseFromOptions((GeneratorOptions *)local_f0,&local_48,error);
  if (!bVar5) goto LAB_00229a3f;
  if (local_ac != kImportClosure) {
LAB_00228560:
    ppFVar11 = (files->
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if ((files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
      uVar28 = 0;
      do {
        pFVar15 = ppFVar11[uVar28];
        local_190 = (undefined1  [8])local_180;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_190,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
        std::__cxx11::string::append((char *)local_190);
        anon_unknown_0::GetJSFilename
                  ((string *)local_1c0,(GeneratorOptions *)local_f0,*(string **)pFVar15);
        p_Var20 = (_Base_ptr)0xf;
        if (local_190 != (undefined1  [8])local_180) {
          p_Var20 = (_Base_ptr)local_180._0_8_;
        }
        p_Var25 = (_Base_ptr)((long)(_func_int ***)local_188 + local_1c0._8_8_);
        if (p_Var20 < p_Var25) {
          p_Var20 = (_Base_ptr)0xf;
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            p_Var20 = (_Base_ptr)local_1c0._16_8_;
          }
          if (p_Var20 < p_Var25) goto LAB_00228627;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,(ulong)local_190);
        }
        else {
LAB_00228627:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_190,local_1c0._0_8_);
        }
        pFVar1 = (FieldDescriptor *)(puVar7 + 2);
        if ((FieldDescriptor *)*puVar7 == pFVar1) {
          local_218._M_allocated_capacity = *(undefined8 *)pFVar1;
          local_218._8_8_ = puVar7[3];
          local_228._0_8_ = (FieldDescriptor *)(local_228 + 0x10);
        }
        else {
          local_218._M_allocated_capacity = *(undefined8 *)pFVar1;
          local_228._0_8_ = (FieldDescriptor *)*puVar7;
        }
        local_228._8_8_ = puVar7[1];
        *puVar7 = pFVar1;
        puVar7[1] = 0;
        *pFVar1 = (FieldDescriptor)0x0;
        if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
          operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
        }
        if (local_190 != (undefined1  [8])local_180) {
          operator_delete((void *)local_190,(ulong)((long)(_Rb_tree_color *)local_180._0_8_ + 1));
        }
        iVar6 = (*local_1d0->_vptr_GeneratorContext[2])(local_1d0,local_228);
        pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar6);
        if (pZVar8 == (ZeroCopyOutputStream *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_190,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                     ,0xdb6);
          pLVar9 = internal::LogMessage::operator<<
                             ((LogMessage *)local_190,"CHECK failed: output.get(): ");
          internal::LogFinisher::operator=((LogFinisher *)local_1c0,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)local_190);
        }
        io::Printer::Printer((Printer *)local_190,pZVar8,'$');
        GenerateFile(local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,pFVar15);
        bVar5 = local_158[0x11];
        io::Printer::~Printer((Printer *)local_190);
        if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
        }
        if ((FieldDescriptor *)local_228._0_8_ != (FieldDescriptor *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
        }
        if (bVar5 != false) goto LAB_00229a3f;
        uVar28 = uVar28 + 1;
        ppFVar11 = (files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar28 < (ulong)((long)(files->
                                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11
                               >> 3));
    }
    goto LAB_00228e8a;
  }
  if (local_98 == (_Base_ptr)0x0 || local_58 != false) {
    if ((local_58 | local_98 != (_Base_ptr)0x0) == 1) goto LAB_00228560;
    local_1c0._8_8_ = local_1c0._8_8_ & 0xffffffff00000000;
    local_1c0._16_8_ = (_Base_ptr)0x0;
    local_1c0._24_8_ = (_Base_ptr)(local_1c0 + 8);
    local_1a0 = (_Base_ptr)(local_1c0 + 8);
    local_198 = 0;
    local_1f8.field_2._M_allocated_capacity = 0;
    local_1f8._M_dataplus._M_p = (pointer)0x0;
    local_1f8._M_string_length = 0;
    local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffff00000000);
    local_180._0_8_ = (_Base_ptr)0x0;
    local_180._8_8_ = (_Base_ptr)local_188;
    local_180._16_8_ = (_Base_ptr)local_188;
    local_180._24_8_ = (pointer)0x0;
    local_218._8_8_ = local_228 + 8;
    local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
    local_218._M_allocated_capacity = 0;
    local_200 = 0;
    ppFVar11 = (files->
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_208 = (_Base_ptr)local_218._8_8_;
    if ((files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
      uVar28 = 0;
      do {
        anon_unknown_0::DepthFirstSearch
                  (ppFVar11[uVar28],
                   (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)&local_1f8,
                   (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)local_190);
        std::
        _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                  ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)local_228,
                   (files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar28);
        uVar28 = uVar28 + 1;
        ppFVar11 = (files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar28 < (ulong)((long)(files->
                                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11
                               >> 3));
    }
    p_Var20 = (_Base_ptr)(local_228 + 8);
    uVar28 = local_1f8._M_string_length - (long)local_1f8._M_dataplus._M_p;
    _Var12._M_p = local_1f8._M_dataplus._M_p;
    if ((long)uVar28 >> 5 < 1) {
LAB_00228e94:
      lVar27 = (long)uVar28 >> 3;
      if (lVar27 == 3) {
        if ((_Base_ptr)local_218._M_allocated_capacity != (_Base_ptr)0x0) {
          uVar28 = *(ulong *)_Var12._M_p;
          p_Var25 = p_Var20;
          uVar21 = local_218._M_allocated_capacity;
          do {
            p_Var16 = (_Base_ptr)uVar21;
            p_Var24 = p_Var25;
            uVar26 = *(ulong *)(p_Var16 + 1);
            p_Var25 = p_Var16;
            if (uVar26 < uVar28) {
              p_Var25 = p_Var24;
            }
            uVar21 = (&p_Var16->_M_left)[uVar26 < uVar28];
          } while ((&p_Var16->_M_left)[uVar26 < uVar28] != (_Base_ptr)0x0);
          if (p_Var25 != p_Var20) {
            if (uVar26 < uVar28) {
              p_Var16 = p_Var24;
            }
            if (*(ulong *)(p_Var16 + 1) <= uVar28) {
              _Var12._M_p = _Var12._M_p + 8;
              goto LAB_00228f0b;
            }
          }
        }
        goto LAB_00228fc0;
      }
      if (lVar27 == 2) {
LAB_00228f0b:
        if ((_Base_ptr)local_218._M_allocated_capacity != (_Base_ptr)0x0) {
          uVar28 = *(ulong *)_Var12._M_p;
          p_Var25 = p_Var20;
          uVar21 = local_218._M_allocated_capacity;
          do {
            p_Var16 = (_Base_ptr)uVar21;
            p_Var24 = p_Var25;
            uVar26 = *(ulong *)(p_Var16 + 1);
            p_Var25 = p_Var16;
            if (uVar26 < uVar28) {
              p_Var25 = p_Var24;
            }
            uVar21 = (&p_Var16->_M_left)[uVar26 < uVar28];
          } while ((&p_Var16->_M_left)[uVar26 < uVar28] != (_Base_ptr)0x0);
          if (p_Var25 != p_Var20) {
            if (uVar26 < uVar28) {
              p_Var16 = p_Var24;
            }
            if (*(ulong *)(p_Var16 + 1) <= uVar28) {
              _Var12._M_p = _Var12._M_p + 8;
              goto LAB_00228eb7;
            }
          }
        }
        goto LAB_00228fc0;
      }
      if (lVar27 == 1) {
LAB_00228eb7:
        if ((_Base_ptr)local_218._M_allocated_capacity != (_Base_ptr)0x0) {
          uVar28 = *(ulong *)_Var12._M_p;
          uVar21 = local_218._M_allocated_capacity;
          p_Var25 = p_Var20;
          do {
            p_Var24 = p_Var25;
            p_Var16 = (_Base_ptr)uVar21;
            uVar26 = *(ulong *)(p_Var16 + 1);
            p_Var25 = p_Var16;
            if (uVar26 < uVar28) {
              p_Var25 = p_Var24;
            }
            uVar21 = (&p_Var16->_M_left)[uVar26 < uVar28];
          } while ((&p_Var16->_M_left)[uVar26 < uVar28] != (_Base_ptr)0x0);
          if (p_Var25 != p_Var20) {
            if (uVar26 < uVar28) {
              p_Var16 = p_Var24;
            }
            if (*(ulong *)(p_Var16 + 1) <= uVar28) {
              _Var12._M_p = (pointer)local_1f8._M_string_length;
            }
          }
        }
        goto LAB_00228fc0;
      }
    }
    else {
      if ((_Base_ptr)local_218._M_allocated_capacity != (_Base_ptr)0x0) {
        uVar26 = uVar28 & 0xffffffffffffffe0;
        lVar27 = (long)uVar28 >> 5;
        do {
          uVar28 = *(ulong *)_Var12._M_p;
          p_Var25 = p_Var20;
          uVar21 = local_218._M_allocated_capacity;
          do {
            p_Var16 = (_Base_ptr)uVar21;
            p_Var24 = p_Var25;
            uVar3 = *(ulong *)(p_Var16 + 1);
            p_Var25 = p_Var16;
            if (uVar3 < uVar28) {
              p_Var25 = p_Var24;
            }
            uVar21 = (&p_Var16->_M_left)[uVar3 < uVar28];
          } while ((&p_Var16->_M_left)[uVar3 < uVar28] != (_Base_ptr)0x0);
          if (p_Var25 == p_Var20) goto LAB_00228fc0;
          if (uVar3 < uVar28) {
            p_Var16 = p_Var24;
          }
          if (uVar28 < *(ulong *)(p_Var16 + 1)) goto LAB_00228fc0;
          uVar28 = *(ulong *)((long)_Var12._M_p + 8);
          p_Var25 = p_Var20;
          uVar21 = local_218._M_allocated_capacity;
          do {
            p_Var16 = (_Base_ptr)uVar21;
            p_Var24 = p_Var25;
            uVar3 = *(ulong *)(p_Var16 + 1);
            p_Var25 = p_Var16;
            if (uVar3 < uVar28) {
              p_Var25 = p_Var24;
            }
            uVar21 = (&p_Var16->_M_left)[uVar3 < uVar28];
          } while ((&p_Var16->_M_left)[uVar3 < uVar28] != (_Base_ptr)0x0);
          if (p_Var25 == p_Var20) {
LAB_00228fb0:
            _Var12._M_p = _Var12._M_p + 8;
            goto LAB_00228fc0;
          }
          if (uVar3 < uVar28) {
            p_Var16 = p_Var24;
          }
          if (uVar28 < *(ulong *)(p_Var16 + 1)) goto LAB_00228fb0;
          uVar28 = *(ulong *)((long)_Var12._M_p + 0x10);
          p_Var25 = p_Var20;
          uVar21 = local_218._M_allocated_capacity;
          do {
            p_Var16 = (_Base_ptr)uVar21;
            p_Var24 = p_Var25;
            uVar3 = *(ulong *)(p_Var16 + 1);
            p_Var25 = p_Var16;
            if (uVar3 < uVar28) {
              p_Var25 = p_Var24;
            }
            uVar21 = (&p_Var16->_M_left)[uVar3 < uVar28];
          } while ((&p_Var16->_M_left)[uVar3 < uVar28] != (_Base_ptr)0x0);
          if (p_Var25 == p_Var20) {
LAB_00228fb6:
            _Var12._M_p = _Var12._M_p + 0x10;
            goto LAB_00228fc0;
          }
          if (uVar3 < uVar28) {
            p_Var16 = p_Var24;
          }
          if (uVar28 < *(ulong *)(p_Var16 + 1)) goto LAB_00228fb6;
          uVar28 = *(ulong *)((long)_Var12._M_p + 0x18);
          p_Var25 = p_Var20;
          uVar21 = local_218._M_allocated_capacity;
          do {
            p_Var16 = (_Base_ptr)uVar21;
            p_Var24 = p_Var25;
            uVar3 = *(ulong *)(p_Var16 + 1);
            p_Var25 = p_Var16;
            if (uVar3 < uVar28) {
              p_Var25 = p_Var24;
            }
            uVar21 = (&p_Var16->_M_left)[uVar3 < uVar28];
          } while ((&p_Var16->_M_left)[uVar3 < uVar28] != (_Base_ptr)0x0);
          if (p_Var25 == p_Var20) {
LAB_00228fbc:
            _Var12._M_p = _Var12._M_p + 0x18;
            goto LAB_00228fc0;
          }
          if (uVar3 < uVar28) {
            p_Var16 = p_Var24;
          }
          if (uVar28 < *(ulong *)(p_Var16 + 1)) goto LAB_00228fbc;
          _Var12._M_p = _Var12._M_p + 0x20;
          bVar5 = 1 < lVar27;
          lVar27 = lVar27 + -1;
        } while (bVar5);
        uVar28 = local_1f8._M_string_length - (long)(local_1f8._M_dataplus._M_p + uVar26);
        _Var12._M_p = (pointer)(local_1f8._M_dataplus._M_p + uVar26);
        goto LAB_00228e94;
      }
LAB_00228fc0:
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)_Var12._M_p + 8);
      if (paVar17 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_string_length && _Var12._M_p != (pointer)local_1f8._M_string_length) {
        do {
          if ((_Base_ptr)local_218._M_allocated_capacity != (_Base_ptr)0x0) {
            uVar28 = paVar17->_M_allocated_capacity;
            uVar21 = local_218._M_allocated_capacity;
            p_Var25 = p_Var20;
            do {
              p_Var24 = p_Var25;
              p_Var16 = (_Base_ptr)uVar21;
              uVar26 = *(ulong *)(p_Var16 + 1);
              p_Var25 = p_Var16;
              if (uVar26 < uVar28) {
                p_Var25 = p_Var24;
              }
              uVar21 = (&p_Var16->_M_left)[uVar26 < uVar28];
            } while ((&p_Var16->_M_left)[uVar26 < uVar28] != (_Base_ptr)0x0);
            if (p_Var25 != p_Var20) {
              if (uVar26 < uVar28) {
                p_Var16 = p_Var24;
              }
              if (*(ulong *)(p_Var16 + 1) <= uVar28) {
                *(ulong *)_Var12._M_p = uVar28;
                _Var12._M_p = _Var12._M_p + 8;
              }
            }
          }
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar17->_M_allocated_capacity + 1);
        } while (paVar17 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1f8._M_string_length);
      }
      if (_Var12._M_p != (pointer)local_1f8._M_string_length) {
        local_1f8._M_string_length = (size_type)_Var12._M_p;
      }
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_228);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_190);
    local_190[0] = local_80;
    local_180._16_8_ = local_180;
    desc = (Descriptor *)0x0;
    local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
    local_180._8_8_ = (_Base_ptr)0x0;
    local_180._32_8_ = 0;
    local_140 = (_Base_ptr)(local_158 + 8);
    local_158._8_4_ = 0;
    local_158._16_8_ = (_Base_ptr)0x0;
    local_130 = (_Base_ptr)0x0;
    local_180._24_8_ = local_180._16_8_;
    local_138 = local_140;
    if ((pointer)local_1f8._M_string_length != local_1f8._M_dataplus._M_p) {
      pDVar30 = (Descriptor *)0x0;
      _Var12._M_p = local_1f8._M_dataplus._M_p;
      local_1d8 = error;
      do {
        pGVar19 = *(GeneratorOptions **)((long)_Var12._M_p + pDVar30 * 8);
        if (0 < (int)(pGVar19->library)._M_string_length) {
          lVar27 = 0;
          lVar29 = 0;
          do {
            pGVar19 = (GeneratorOptions *)
                      ((pGVar19->library).field_2._M_allocated_capacity + lVar27);
            (anonymous_namespace)::GetMessageFileName_abi_cxx11_
                      ((string *)local_228,(_anonymous_namespace_ *)local_f0,pGVar19,desc);
            error = local_1d8;
            bVar5 = anon_unknown_0::FileDeduplicator::AddFile
                              ((FileDeduplicator *)local_190,(string *)local_228,pGVar19,local_1d8);
            if ((FieldDescriptor *)local_228._0_8_ != (FieldDescriptor *)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
            }
            if (!bVar5) goto LAB_002292c2;
            lVar29 = lVar29 + 1;
            pGVar19 = *(GeneratorOptions **)(local_1f8._M_dataplus._M_p + (long)pDVar30 * 8);
            desc = (Descriptor *)(long)(int)(pGVar19->library)._M_string_length;
            lVar27 = lVar27 + 0xa8;
            _Var12._M_p = local_1f8._M_dataplus._M_p;
          } while (lVar29 < (long)desc);
        }
        if (0 < *(int *)((long)&(pGVar19->library).field_2 + 8)) {
          lVar27 = 0;
          lVar29 = 0;
          do {
            pGVar19 = (GeneratorOptions *)(*(long *)&pGVar19->error_on_name_conflict + lVar27);
            (anonymous_namespace)::GetEnumFileName_abi_cxx11_
                      ((string *)local_228,(_anonymous_namespace_ *)local_f0,pGVar19,
                       (EnumDescriptor *)desc);
            error = local_1d8;
            bVar5 = anon_unknown_0::FileDeduplicator::AddFile
                              ((FileDeduplicator *)local_190,(string *)local_228,pGVar19,local_1d8);
            if ((FieldDescriptor *)local_228._0_8_ != (FieldDescriptor *)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
            }
            if (!bVar5) goto LAB_002292c2;
            lVar29 = lVar29 + 1;
            pGVar19 = *(GeneratorOptions **)(local_1f8._M_dataplus._M_p + (long)pDVar30 * 8);
            desc = (Descriptor *)(long)*(int *)((long)&(pGVar19->library).field_2 + 8);
            lVar27 = lVar27 + 0x38;
            _Var12._M_p = local_1f8._M_dataplus._M_p;
          } while (lVar29 < (long)desc);
        }
        if (0 < *(int *)&(pGVar19->extension).field_2) {
          lVar29 = 0x58;
          lVar27 = 0;
          bVar5 = false;
          do {
            if (*(char *)(*(long *)&pGVar19->one_output_file_per_input_file + -8 + lVar29) == '\x01'
               ) {
              iVar6 = std::__cxx11::string::compare
                                ((char *)**(undefined8 **)
                                           (*(long *)(*(long *)&pGVar19->
                                                  one_output_file_per_input_file + lVar29) + 0x10));
              bVar5 = (bool)(bVar5 | iVar6 != 0);
              _Var12._M_p = local_1f8._M_dataplus._M_p;
            }
            lVar27 = lVar27 + 1;
            pGVar19 = *(GeneratorOptions **)((long)_Var12._M_p + pDVar30 * 8);
            pFVar15 = (FileDescriptor *)(long)*(int *)&(pGVar19->extension).field_2;
            lVar29 = lVar29 + 0xa8;
          } while (lVar27 < (long)pFVar15);
          if (bVar5) {
            (anonymous_namespace)::GetExtensionFileName_abi_cxx11_
                      ((string *)local_228,(_anonymous_namespace_ *)local_f0,pGVar19,pFVar15);
            bVar5 = anon_unknown_0::FileDeduplicator::AddFile
                              ((FileDeduplicator *)local_190,(string *)local_228,
                               *(void **)(local_1f8._M_dataplus._M_p + (long)pDVar30 * 8),error);
            if ((FieldDescriptor *)local_228._0_8_ != (FieldDescriptor *)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
            }
            _Var12._M_p = local_1f8._M_dataplus._M_p;
            if (!bVar5) {
              bVar5 = false;
              goto LAB_002292c9;
            }
          }
        }
        pDVar30 = pDVar30 + 1;
        desc = (Descriptor *)((long)(local_1f8._M_string_length - (long)_Var12._M_p) >> 3);
      } while (pDVar30 < desc);
    }
    bVar5 = true;
    std::
    _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
    ::operator=((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                 *)local_1c0,
                (_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                 *)local_158);
    goto LAB_002292c9;
  }
  local_228._0_8_ = (FieldDescriptor *)(local_228 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
  std::__cxx11::string::append(local_228);
  plVar10 = (long *)std::__cxx11::string::_M_append(local_228,(ulong)local_a0._M_p);
  pp_Var13 = (_Base_ptr *)(plVar10 + 2);
  if ((_Base_ptr *)*plVar10 == pp_Var13) {
    local_180._0_8_ = *pp_Var13;
    local_180._8_8_ = plVar10[3];
    local_190 = (undefined1  [8])local_180;
  }
  else {
    local_180._0_8_ = *pp_Var13;
    local_190 = (undefined1  [8])*plVar10;
  }
  local_188 = (undefined1  [8])plVar10[1];
  *plVar10 = (long)pp_Var13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_1f8,(GeneratorOptions *)local_f0);
  p_Var20 = (_Base_ptr)0xf;
  if (local_190 != (undefined1  [8])local_180) {
    p_Var20 = (_Base_ptr)local_180._0_8_;
  }
  if (p_Var20 < (_Base_ptr)(local_1f8._M_string_length + (long)local_188)) {
    uVar21 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      uVar21 = local_1f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < (_Base_ptr)(local_1f8._M_string_length + (long)local_188))
    goto LAB_00228af4;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_00228af4:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append(local_190,(ulong)local_1f8._M_dataplus._M_p);
  }
  local_1c0._0_8_ = local_1c0 + 0x10;
  pcVar2 = (pointer)(puVar7 + 2);
  if ((pointer)*puVar7 == pcVar2) {
    local_1c0._16_8_ = *(undefined8 *)pcVar2;
    local_1c0._24_8_ = puVar7[3];
  }
  else {
    local_1c0._16_8_ = *(undefined8 *)pcVar2;
    local_1c0._0_8_ = (pointer)*puVar7;
  }
  local_1c0._8_8_ = puVar7[1];
  *puVar7 = pcVar2;
  puVar7[1] = 0;
  *pcVar2 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,(ulong)(local_1f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_190 != (undefined1  [8])local_180) {
    operator_delete((void *)local_190,(ulong)((long)(_Rb_tree_color *)local_180._0_8_ + 1));
  }
  if ((FieldDescriptor *)local_228._0_8_ != (FieldDescriptor *)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
  }
  iVar6 = (*local_1d0->_vptr_GeneratorContext[2])(local_1d0,local_1c0);
  output = (GeneratorContext *)CONCAT44(extraout_var_00,iVar6);
  if (output == (GeneratorContext *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_190,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xd30);
    pLVar9 = internal::LogMessage::operator<<
                       ((LogMessage *)local_190,"CHECK failed: output.get(): ");
    internal::LogFinisher::operator=((LogFinisher *)local_228,pLVar9);
    internal::LogMessage::~LogMessage((LogMessage *)local_190);
  }
  local_1d0 = output;
  io::Printer::Printer((Printer *)local_190,(ZeroCopyOutputStream *)output,'$');
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity = 0;
  ppFVar11 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppFVar14 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar14 != ppFVar11) {
    uVar28 = 0;
    do {
      pFVar15 = ppFVar11[uVar28];
      if (0 < *(int *)(pFVar15 + 0x88)) {
        lVar27 = 0;
        lVar29 = 0;
        do {
          local_228._0_8_ = *(long *)(pFVar15 + 0x98) + lVar27;
          if (local_1f8._M_string_length == local_1f8.field_2._M_allocated_capacity) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_1f8,(iterator)local_1f8._M_string_length,
                       (FieldDescriptor **)local_228);
          }
          else {
            *(undefined8 *)local_1f8._M_string_length = local_228._0_8_;
            local_1f8._M_string_length = local_1f8._M_string_length + 8;
          }
          lVar29 = lVar29 + 1;
          ppFVar11 = (files->
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pFVar15 = ppFVar11[uVar28];
          lVar27 = lVar27 + 0xa8;
        } while (lVar29 < *(int *)(pFVar15 + 0x88));
        ppFVar14 = (files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < (ulong)((long)ppFVar14 - (long)ppFVar11 >> 3));
  }
  io::Printer::Print((Printer *)local_190,
                     "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                    );
  local_218._8_8_ = local_228 + 8;
  local_228._8_8_ = (ulong)(uint)local_228._12_4_ << 0x20;
  local_218._M_allocated_capacity = 0;
  local_200 = 0;
  pGVar22 = local_1c8;
  local_208 = (_Base_ptr)local_218._8_8_;
  FindProvides(local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,files,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_228);
  FindProvidesForFields
            (pGVar22,(GeneratorOptions *)local_f0,printer_00,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_1f8,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_228);
  GenerateProvides(pGVar22,(GeneratorOptions *)local_f0,(Printer *)local_190,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_228);
  if (local_a7 == true) {
    io::Printer::Print((Printer *)local_190,"goog.setTestOnly();\n\n");
  }
  io::Printer::Print((Printer *)local_190,"\n");
  GenerateRequiresForLibrary
            (local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,files,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_228);
  GenerateFilesInDepOrder(local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,files);
  if ((pointer)local_1f8._M_string_length != local_1f8._M_dataplus._M_p) {
    uVar28 = 0;
    _Var12._M_p = local_1f8._M_dataplus._M_p;
    do {
      if (*(char *)(*(ulong *)((long)_Var12._M_p + uVar28 * 8) + 0x50) == '\x01') {
        pGVar22 = (Generator *)
                  **(undefined8 **)
                    (*(long *)(*(ulong *)((long)_Var12._M_p + uVar28 * 8) + 0x58) + 0x10);
        iVar6 = std::__cxx11::string::compare((char *)pGVar22);
        _Var12._M_p = local_1f8._M_dataplus._M_p;
        if (iVar6 != 0) {
          GenerateExtension(pGVar22,(GeneratorOptions *)local_f0,(Printer *)local_190,
                            *(FieldDescriptor **)(local_1f8._M_dataplus._M_p + uVar28 * 8));
          _Var12._M_p = local_1f8._M_dataplus._M_p;
        }
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < (ulong)((long)(local_1f8._M_string_length - (long)_Var12._M_p) >> 3));
  }
  bVar5 = local_158[0x11];
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p);
  }
  io::Printer::~Printer((Printer *)local_190);
  if (local_1d0 != (GeneratorContext *)0x0) {
    (*local_1d0->_vptr_GeneratorContext[1])();
  }
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
  }
  if (bVar5 != false) {
LAB_00229a3f:
    bVar5 = false;
    goto LAB_00229a41;
  }
  goto LAB_00228e8a;
LAB_002292c2:
  bVar5 = false;
LAB_002292c9:
  std::
  _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
  ::~_Rb_tree((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
               *)local_158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
               *)local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p);
  }
  if (!bVar5) {
LAB_00229a35:
    std::
    _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
    ::~_Rb_tree((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                 *)local_1c0);
    goto LAB_00229a3f;
  }
  ppFVar11 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
    psVar18 = (string *)0x0;
    do {
      local_1d8 = psVar18;
      pGVar19 = (GeneratorOptions *)ppFVar11[(long)psVar18];
      iVar6 = (int)(pGVar19->library)._M_string_length;
      if (0 < iVar6) {
        lVar27 = 0;
        do {
          if ((_Base_ptr)local_1c0._16_8_ != (_Base_ptr)0x0) {
            pGVar31 = (GeneratorOptions *)
                      (lVar27 * 0xa8 + (pGVar19->library).field_2._M_allocated_capacity);
            p_Var20 = (_Base_ptr)local_1c0._16_8_;
            p_Var25 = (_Base_ptr)(local_1c0 + 8);
            do {
              p_Var24 = p_Var25;
              p_Var16 = p_Var20;
              pGVar4 = *(GeneratorOptions **)(p_Var16 + 1);
              p_Var25 = p_Var16;
              if (pGVar4 < pGVar31) {
                p_Var25 = p_Var24;
              }
              p_Var20 = *(_Base_ptr *)(&p_Var16->_M_left + (pGVar4 < pGVar31));
            } while (*(_Base_ptr *)(&p_Var16->_M_left + (pGVar4 < pGVar31)) != (_Base_ptr)0x0);
            if (p_Var25 != (_Base_ptr)(local_1c0 + 8)) {
              if (pGVar4 < pGVar31) {
                p_Var16 = p_Var24;
              }
              if (*(GeneratorOptions **)(p_Var16 + 1) <= pGVar31) {
                (anonymous_namespace)::GetMessageFileName_abi_cxx11_
                          (&local_1f8,(_anonymous_namespace_ *)local_f0,pGVar31,
                           (Descriptor *)p_Var24);
                iVar6 = (*local_1d0->_vptr_GeneratorContext[2])(local_1d0,&local_1f8);
                pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar6);
                if (pZVar8 == (ZeroCopyOutputStream *)0x0) {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_190,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                             ,0xd62);
                  pLVar9 = internal::LogMessage::operator<<
                                     ((LogMessage *)local_190,"CHECK failed: output.get(): ");
                  internal::LogFinisher::operator=((LogFinisher *)local_228,pLVar9);
                  internal::LogMessage::~LogMessage((LogMessage *)local_190);
                }
                io::Printer::Printer((Printer *)local_190,pZVar8,'$');
                io::Printer::Print((Printer *)local_190,
                                   "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                                  );
                local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
                local_218._M_allocated_capacity = 0;
                local_218._8_8_ = local_228 + 8;
                local_200 = 0;
                pGVar22 = local_1c8;
                local_208 = (_Base_ptr)local_218._8_8_;
                FindProvidesForMessage
                          (local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,
                           (Descriptor *)pGVar31,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_228);
                GenerateProvides(pGVar22,(GeneratorOptions *)local_f0,(Printer *)local_190,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_228);
                if (local_a7 == true) {
                  io::Printer::Print((Printer *)local_190,"goog.setTestOnly();\n\n");
                }
                io::Printer::Print((Printer *)local_190,"\n");
                GenerateRequiresForMessage
                          (local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,
                           (Descriptor *)pGVar31,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_228);
                GenerateClass(local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,
                              (Descriptor *)pGVar31);
                bVar5 = local_158[0x11];
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_228);
                io::Printer::~Printer((Printer *)local_190);
                if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
                  (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  (ulong)(local_1f8.field_2._M_allocated_capacity + 1));
                }
                if (bVar5 != false) goto LAB_00229a35;
                iVar6 = (int)(pGVar19->library)._M_string_length;
              }
            }
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < iVar6);
      }
      iVar6 = *(int *)((long)&(pGVar19->library).field_2 + 8);
      if (0 < iVar6) {
        lVar27 = 0;
        do {
          if ((_Base_ptr)local_1c0._16_8_ != (_Base_ptr)0x0) {
            pGVar31 = (GeneratorOptions *)
                      (lVar27 * 0x38 + *(long *)&pGVar19->error_on_name_conflict);
            p_Var20 = (_Base_ptr)local_1c0._16_8_;
            p_Var25 = (_Base_ptr)(local_1c0 + 8);
            do {
              p_Var24 = p_Var25;
              p_Var16 = p_Var20;
              pGVar4 = *(GeneratorOptions **)(p_Var16 + 1);
              p_Var25 = p_Var16;
              if (pGVar4 < pGVar31) {
                p_Var25 = p_Var24;
              }
              p_Var20 = *(_Base_ptr *)(&p_Var16->_M_left + (pGVar4 < pGVar31));
            } while (*(_Base_ptr *)(&p_Var16->_M_left + (pGVar4 < pGVar31)) != (_Base_ptr)0x0);
            if (p_Var25 != (_Base_ptr)(local_1c0 + 8)) {
              if (pGVar4 < pGVar31) {
                p_Var16 = p_Var24;
              }
              if (*(GeneratorOptions **)(p_Var16 + 1) <= pGVar31) {
                (anonymous_namespace)::GetEnumFileName_abi_cxx11_
                          (&local_1f8,(_anonymous_namespace_ *)local_f0,pGVar31,
                           (EnumDescriptor *)p_Var24);
                iVar6 = (*local_1d0->_vptr_GeneratorContext[2])(local_1d0,&local_1f8);
                pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar6);
                if (pZVar8 == (ZeroCopyOutputStream *)0x0) {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_190,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                             ,0xd7c);
                  pLVar9 = internal::LogMessage::operator<<
                                     ((LogMessage *)local_190,"CHECK failed: output.get(): ");
                  internal::LogFinisher::operator=((LogFinisher *)local_228,pLVar9);
                  internal::LogMessage::~LogMessage((LogMessage *)local_190);
                }
                io::Printer::Printer((Printer *)local_190,pZVar8,'$');
                pPVar23 = (Printer *)local_190;
                io::Printer::Print((Printer *)local_190,
                                   "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                                  );
                local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
                local_218._M_allocated_capacity = 0;
                local_218._8_8_ = local_228 + 8;
                local_200 = 0;
                local_208 = (_Base_ptr)local_218._8_8_;
                FindProvidesForEnum((Generator *)pPVar23,(GeneratorOptions *)local_f0,printer_01,
                                    (EnumDescriptor *)pGVar31,
                                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_228);
                GenerateProvides((Generator *)pPVar23,(GeneratorOptions *)local_f0,
                                 (Printer *)local_190,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_228);
                if (local_a7 == true) {
                  io::Printer::Print((Printer *)local_190,"goog.setTestOnly();\n\n");
                }
                pPVar23 = (Printer *)local_190;
                io::Printer::Print((Printer *)local_190,"\n");
                GenerateEnum((Generator *)pPVar23,(GeneratorOptions *)local_f0,(Printer *)local_190,
                             (EnumDescriptor *)pGVar31);
                bVar5 = local_158[0x11];
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_228);
                io::Printer::~Printer((Printer *)local_190);
                if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
                  (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  (ulong)(local_1f8.field_2._M_allocated_capacity + 1));
                }
                if (bVar5 != false) goto LAB_00229a35;
                iVar6 = *(int *)((long)&(pGVar19->library).field_2 + 8);
              }
            }
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < iVar6);
      }
      p_Var20 = (_Base_ptr)local_1c0._16_8_;
      p_Var25 = (_Base_ptr)(local_1c0 + 8);
      if ((_Base_ptr)local_1c0._16_8_ != (_Base_ptr)0x0) {
        do {
          p_Var24 = p_Var25;
          p_Var16 = p_Var20;
          pGVar31 = *(GeneratorOptions **)(p_Var16 + 1);
          p_Var25 = p_Var16;
          if (pGVar31 < pGVar19) {
            p_Var25 = p_Var24;
          }
          p_Var20 = *(_Base_ptr *)(&p_Var16->_M_left + (pGVar31 < pGVar19));
        } while (*(_Base_ptr *)(&p_Var16->_M_left + (pGVar31 < pGVar19)) != (_Base_ptr)0x0);
        if (p_Var25 != (_Base_ptr)(local_1c0 + 8)) {
          if (pGVar31 < pGVar19) {
            p_Var16 = p_Var24;
          }
          if (*(GeneratorOptions **)(p_Var16 + 1) <= pGVar19) {
            (anonymous_namespace)::GetExtensionFileName_abi_cxx11_
                      (&local_1f8,(_anonymous_namespace_ *)local_f0,pGVar19,
                       (FileDescriptor *)p_Var16);
            iVar6 = (*local_1d0->_vptr_GeneratorContext[2])(local_1d0,&local_1f8);
            psVar18 = local_1d8;
            pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar6);
            if (pZVar8 == (ZeroCopyOutputStream *)0x0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_190,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,0xd93);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_190,"CHECK failed: output.get(): ");
              internal::LogFinisher::operator=((LogFinisher *)local_228,pLVar9);
              internal::LogMessage::~LogMessage((LogMessage *)local_190);
            }
            io::Printer::Printer((Printer *)local_190,pZVar8,'$');
            pPVar23 = (Printer *)local_190;
            io::Printer::Print((Printer *)local_190,
                               "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                              );
            local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
            local_218._M_allocated_capacity = 0;
            local_218._8_8_ = local_228 + 8;
            local_200 = 0;
            local_108._16_8_ = (pointer)0x0;
            local_108._0_8_ = (pointer)0x0;
            local_108._8_8_ = (ZeroCopyOutputStream *)0x0;
            ppFVar11 = (files->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            pFVar15 = ppFVar11[(long)psVar18];
            printer_02 = extraout_RDX;
            local_208 = (_Base_ptr)local_218._8_8_;
            if (0 < *(int *)(pFVar15 + 0x88)) {
              lVar27 = 0;
              lVar29 = 0;
              do {
                if (*(char *)(*(long *)(pFVar15 + 0x98) + 0x50 + lVar27) == '\x01') {
                  pPVar23 = (Printer *)
                            **(undefined8 **)
                              (*(long *)(*(long *)(pFVar15 + 0x98) + 0x58 + lVar27) + 0x10);
                  iVar6 = std::__cxx11::string::compare((char *)pPVar23);
                  ppFVar11 = (files->
                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                  if (iVar6 != 0) {
                    local_50 = (FieldDescriptor *)
                               (*(long *)(ppFVar11[(long)local_1d8] + 0x98) + lVar27);
                    pPVar23 = (Printer *)local_108;
                    std::
                    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    ::emplace_back<google::protobuf::FieldDescriptor_const*>
                              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                *)pPVar23,&local_50);
                    ppFVar11 = (files->
                               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                  }
                }
                lVar29 = lVar29 + 1;
                pFVar15 = ppFVar11[(long)local_1d8];
                printer_02 = (Printer *)(long)*(int *)(pFVar15 + 0x88);
                lVar27 = lVar27 + 0xa8;
              } while (lVar29 < (long)printer_02);
            }
            FindProvidesForFields
                      ((Generator *)pPVar23,(GeneratorOptions *)local_f0,printer_02,
                       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)local_108,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_228);
            GenerateProvides((Generator *)pPVar23,(GeneratorOptions *)local_f0,(Printer *)local_190,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_228);
            if (local_a7 == true) {
              io::Printer::Print((Printer *)local_190,"goog.setTestOnly();\n\n");
            }
            io::Printer::Print((Printer *)local_190,"\n");
            GenerateRequiresForExtensions
                      (local_1c8,(GeneratorOptions *)local_f0,(Printer *)local_190,
                       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)local_108,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_228);
            ppFVar11 = (files->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            pFVar15 = ppFVar11[(long)local_1d8];
            if (0 < *(int *)(pFVar15 + 0x88)) {
              lVar27 = 0;
              lVar29 = 0;
              do {
                if (*(char *)(*(long *)(pFVar15 + 0x98) + 0x50 + lVar27) == '\x01') {
                  pGVar22 = (Generator *)
                            **(undefined8 **)
                              (*(long *)(*(long *)(pFVar15 + 0x98) + 0x58 + lVar27) + 0x10);
                  iVar6 = std::__cxx11::string::compare((char *)pGVar22);
                  ppFVar11 = (files->
                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                  if (iVar6 != 0) {
                    GenerateExtension(pGVar22,(GeneratorOptions *)local_f0,(Printer *)local_190,
                                      (FieldDescriptor *)
                                      (*(long *)(ppFVar11[(long)local_1d8] + 0x98) + lVar27));
                    ppFVar11 = (files->
                               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                  }
                }
                lVar29 = lVar29 + 1;
                pFVar15 = ppFVar11[(long)local_1d8];
                lVar27 = lVar27 + 0xa8;
              } while (lVar29 < *(int *)(pFVar15 + 0x88));
            }
            if ((pointer)local_108._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_228);
            io::Printer::~Printer((Printer *)local_190);
            if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,
                              (ulong)(local_1f8.field_2._M_allocated_capacity + 1));
            }
          }
        }
      }
      psVar18 = (string *)((long)&(local_1d8->_M_dataplus)._M_p + 1);
      ppFVar11 = (files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    } while (psVar18 < (string *)
                       ((long)(files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3));
  }
  std::
  _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
  ::~_Rb_tree((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
               *)local_1c0);
LAB_00228e8a:
  bVar5 = true;
LAB_00229a41:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._32_8_ != &local_c0) {
    operator_delete((void *)local_f0._32_8_,local_c0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return bVar5;
}

Assistant:

bool Generator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                            const string& parameter,
                            GeneratorContext* context,
                            string* error) const {
  std::vector< std::pair< string, string > > option_pairs;
  ParseGeneratorParameter(parameter, &option_pairs);
  GeneratorOptions options;
  if (!options.ParseFromOptions(option_pairs, error)) {
    return false;
  }


  if (options.output_mode() == GeneratorOptions::kEverythingInOneFile) {
    // All output should go in a single file.
    string filename = options.output_dir + "/" + options.library +
                      options.GetFileNameExtension();
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GOOGLE_CHECK(output.get());
    io::Printer printer(output.get(), '$');

    // Pull out all extensions -- we need these to generate all
    // provides/requires.
    std::vector<const FieldDescriptor*> extensions;
    for (int i = 0; i < files.size(); i++) {
      for (int j = 0; j < files[i]->extension_count(); j++) {
        const FieldDescriptor* extension = files[i]->extension(j);
        extensions.push_back(extension);
      }
    }

    GenerateHeader(options, &printer);

    std::set<string> provided;
    FindProvides(options, &printer, files, &provided);
    FindProvidesForFields(options, &printer, extensions, &provided);
    GenerateProvides(options, &printer, &provided);
    GenerateTestOnly(options, &printer);
    GenerateRequiresForLibrary(options, &printer, files, &provided);

    GenerateFilesInDepOrder(options, &printer, files);

    for (int i = 0; i < extensions.size(); i++) {
      if (ShouldGenerateExtension(extensions[i])) {
        GenerateExtension(options, &printer, extensions[i]);
      }
    }

    if (printer.failed()) {
      return false;
    }
  } else if (options.output_mode() == GeneratorOptions::kOneOutputFilePerType) {
    std::set<const void*> allowed_set;
    if (!GenerateJspbAllowedSet(options, files, &allowed_set, error)) {
      return false;
    }

    for (int i = 0; i < files.size(); i++) {
      const FileDescriptor* file = files[i];
      for (int j = 0; j < file->message_type_count(); j++) {
        const Descriptor* desc = file->message_type(j);
        if (allowed_set.count(desc) == 0) {
          continue;
        }

        string filename = GetMessageFileName(options, desc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForMessage(options, &printer, desc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForMessage(options, &printer, desc, &provided);

        GenerateClass(options, &printer, desc);

        if (printer.failed()) {
          return false;
        }
      }
      for (int j = 0; j < file->enum_type_count(); j++) {
        const EnumDescriptor* enumdesc = file->enum_type(j);
        if (allowed_set.count(enumdesc) == 0) {
          continue;
        }

        string filename = GetEnumFileName(options, enumdesc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForEnum(options, &printer, enumdesc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);

        GenerateEnum(options, &printer, enumdesc);

        if (printer.failed()) {
          return false;
        }
      }
      // File-level extensions (message-level extensions are generated under
      // the enclosing message).
      if (allowed_set.count(file) == 1) {
        string filename = GetExtensionFileName(options, file);

        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        std::vector<const FieldDescriptor*> fields;

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            fields.push_back(files[i]->extension(j));
          }
        }

        FindProvidesForFields(options, &printer, fields, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForExtensions(options, &printer, fields, &provided);

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            GenerateExtension(options, &printer, files[i]->extension(j));
          }
        }
      }
    }
  } else /* options.output_mode() == kOneOutputFilePerInputFile */ {
    // Generate one output file per input (.proto) file.

    for (int i = 0; i < files.size(); i++) {
      const google::protobuf::FileDescriptor* file = files[i];

      string filename =
          options.output_dir + "/" + GetJSFilename(options, file->name());
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
      GOOGLE_CHECK(output.get());
      io::Printer printer(output.get(), '$');

      GenerateFile(options, &printer, file);

      if (printer.failed()) {
        return false;
      }
    }
  }

  return true;
}